

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O0

Simplex_ptr_set * __thiscall
Gudhi::Toplex_map::maximal_simplices
          (Simplex_ptr_set *__return_storage_ptr__,Toplex_map *this,size_t max_number)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_58;
  size_t local_20;
  size_t max_number_local;
  Toplex_map *this_local;
  
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_20 = max_number;
  max_number_local = (size_t)this;
  this_local = (Toplex_map *)__return_storage_ptr__;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set(&local_58);
  maximal_cofaces<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
            (__return_storage_ptr__,this,&local_58,local_20);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set(&local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

Toplex_map::Simplex_ptr_set maximal_simplices(const std::size_t max_number = 0) const {
    return maximal_cofaces(Simplex(), max_number);
  }